

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O2

string * __thiscall
flatbuffers::kotlin::KotlinGenerator::NotFoundReturn_abi_cxx11_
          (string *__return_storage_ptr__,KotlinGenerator *this,BaseType el)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_f;
  allocator<char> local_e;
  allocator<char> local_d;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  switch((int)this) {
  case 1:
  case 4:
  case 6:
  case 8:
    __s = "0u";
    __a = &local_d;
    break;
  case 2:
    __s = "false";
    __a = &local_b;
    break;
  case 3:
  case 5:
  case 7:
  case 9:
    __s = "0";
    __a = &local_c;
    break;
  case 10:
    __s = "0uL";
    __a = &local_e;
    break;
  case 0xb:
    __s = "0.0f";
    __a = &local_9;
    break;
  case 0xc:
    __s = "0.0";
    __a = &local_a;
    break;
  default:
    __s = "null";
    __a = &local_f;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

static std::string NotFoundReturn(BaseType el) {
    switch (el) {
      case BASE_TYPE_FLOAT: return "0.0f";
      case BASE_TYPE_DOUBLE: return "0.0";
      case BASE_TYPE_BOOL: return "false";
      case BASE_TYPE_LONG:
      case BASE_TYPE_INT:
      case BASE_TYPE_CHAR:
      case BASE_TYPE_SHORT: return "0";
      case BASE_TYPE_UINT:
      case BASE_TYPE_UCHAR:
      case BASE_TYPE_USHORT:
      case BASE_TYPE_UTYPE: return "0u";
      case BASE_TYPE_ULONG: return "0uL";
      default: return "null";
    }
  }